

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

void change_var_names(MIR_context_t new_ctx,VARR_MIR_var_t *vars)

{
  MIR_var_t *pMVar1;
  char *pcVar2;
  MIR_var_t *var_ptr;
  size_t i;
  VARR_MIR_var_t *vars_local;
  MIR_context_t new_ctx_local;
  
  var_ptr = (MIR_var_t *)0x0;
  while( true ) {
    pMVar1 = (MIR_var_t *)VARR_MIR_var_tlength(vars);
    if (pMVar1 <= var_ptr) break;
    pMVar1 = VARR_MIR_var_taddr(vars);
    pcVar2 = get_ctx_str(new_ctx,pMVar1[(long)var_ptr].name);
    pMVar1[(long)var_ptr].name = pcVar2;
    var_ptr = (MIR_var_t *)((long)&var_ptr->type + 1);
  }
  return;
}

Assistant:

static void change_var_names (MIR_context_t new_ctx, VARR (MIR_var_t) * vars) {
  for (size_t i = 0; i < VARR_LENGTH (MIR_var_t, vars); i++) {
    MIR_var_t *var_ptr = &VARR_ADDR (MIR_var_t, vars)[i];
    var_ptr->name = get_ctx_str (new_ctx, var_ptr->name);
  }
}